

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaOutputFile::ToYa::writeTile(ToYa *this,int dx,int dy,int lx,int ly)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  ArgExc *this_00;
  long lVar6;
  Rgba *pRVar7;
  Rgba *pRVar8;
  long lVar9;
  long in_RDI;
  FrameBuffer fb;
  int x1;
  int x;
  int y1;
  int y;
  int width;
  Box2i dw;
  stringstream _iex_throw_s;
  FrameBuffer *in_stack_00000258;
  TiledOutputFile *in_stack_00000260;
  int iVar10;
  int in_stack_fffffffffffffd14;
  int dy_00;
  int in_stack_fffffffffffffd1c;
  TiledOutputFile *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 uVar11;
  Slice local_270;
  Slice local_238;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  stringstream local_1a0 [16];
  ostream local_190 [152];
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  TiledOutputFile *in_stack_ffffffffffffff18;
  Slice *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  FrameBuffer *in_stack_ffffffffffffffc0;
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar4 = std::operator<<(local_190,
                             "No frame buffer was specified as the pixel data source for image file \""
                            );
    pcVar5 = TiledOutputFile::fileName((TiledOutputFile *)0x1acfd7);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\".");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  TiledOutputFile::dataWindowForTile
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  local_1c0 = (local_1b4 - local_1bc) + 1;
  local_1c8 = 0;
  for (local_1c4 = local_1b8; local_1c4 <= local_1b0; local_1c4 = local_1c4 + 1) {
    local_1d0 = 0;
    for (local_1cc = local_1bc; local_1cc <= local_1b4; local_1cc = local_1cc + 1) {
      lVar1 = *(long *)(in_RDI + 0x60);
      lVar6 = (long)local_1cc;
      lVar2 = *(long *)(in_RDI + 0x68);
      lVar9 = (long)local_1c4;
      lVar3 = *(long *)(in_RDI + 0x70);
      pRVar7 = Array2D<Imf_2_5::Rgba>::operator[]
                         ((Array2D<Imf_2_5::Rgba> *)(in_RDI + 0x48),(long)local_1c8);
      pRVar7[local_1d0] = *(Rgba *)(lVar1 + (lVar6 * lVar2 + lVar9 * lVar3) * 8);
      local_1d0 = local_1d0 + 1;
    }
    pRVar7 = (Rgba *)(in_RDI + 0x3c);
    uVar11 = *(undefined1 *)(in_RDI + 0x30);
    iVar10 = local_1c0;
    pRVar8 = Array2D<Imf_2_5::Rgba>::operator[]
                       ((Array2D<Imf_2_5::Rgba> *)(in_RDI + 0x48),(long)local_1c8);
    Array2D<Imf_2_5::Rgba>::operator[]((Array2D<Imf_2_5::Rgba> *)(in_RDI + 0x48),(long)local_1c8);
    RgbaYca::RGBAtoYCA((V3f *)CONCAT17(uVar11,in_stack_fffffffffffffd50),
                       (int)((ulong)pRVar8 >> 0x20),SUB81((ulong)pRVar8 >> 0x18,0),
                       (Rgba *)CONCAT44(iVar10,in_stack_fffffffffffffd40),pRVar7);
    local_1c8 = local_1c8 + 1;
  }
  FrameBuffer::FrameBuffer((FrameBuffer *)0x1ad23f);
  pRVar7 = Array2D<Imf_2_5::Rgba>::operator[]
                     ((Array2D<Imf_2_5::Rgba> *)(in_RDI + 0x48),(long)-local_1b8);
  Slice::Slice(&local_238,HALF,(char *)&pRVar7[-local_1bc].g,8,(ulong)*(uint *)(in_RDI + 0x34) << 3,
               1,1,0.0,false,false);
  FrameBuffer::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  pRVar7 = Array2D<Imf_2_5::Rgba>::operator[]
                     ((Array2D<Imf_2_5::Rgba> *)(in_RDI + 0x48),(long)-local_1b8);
  dy_00 = 0;
  iVar10 = 0;
  Slice::Slice(&local_270,HALF,(char *)&pRVar7[-local_1bc].a,8,(ulong)*(uint *)(in_RDI + 0x34) << 3,
               1,1,0.0,false,false);
  FrameBuffer::insert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0)
  ;
  TiledOutputFile::setFrameBuffer(in_stack_00000260,in_stack_00000258);
  TiledOutputFile::writeTile
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c,dy_00,in_stack_fffffffffffffd14,
             iVar10);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x1ad3d9);
  return;
}

Assistant:

void
TiledRgbaOutputFile::ToYa::writeTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data source for image file "
			    "\"" << _outputFile.fileName() << "\".");
    }

    //
    // Copy the tile's RGBA pixels into _buf and convert
    // them to luminance/alpha format
    //

    Box2i dw = _outputFile.dataWindowForTile (dx, dy, lx, ly);
    int width = dw.max.x - dw.min.x + 1;

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
	for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
	    _buf[y1][x1] = _fbBase[x * _fbXStride + y * _fbYStride];

	RGBAtoYCA (_yw, width, _writeA, _buf[y1], _buf[y1]);
    }

    //
    // Store the contents of _buf in the output file
    //

    FrameBuffer fb;

    fb.insert ("Y", Slice (HALF,				   // type
			   (char *) &_buf[-dw.min.y][-dw.min.x].g, // base
			   sizeof (Rgba),			   // xStride
			   sizeof (Rgba) * _tileXSize));	   // yStride

    fb.insert ("A", Slice (HALF,				   // type
			   (char *) &_buf[-dw.min.y][-dw.min.x].a, // base
			   sizeof (Rgba),			   // xStride
			   sizeof (Rgba) * _tileXSize));	   // yStride

    _outputFile.setFrameBuffer (fb);
    _outputFile.writeTile (dx, dy, lx, ly);
}